

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_suite.cpp
# Opt level: O1

void ostringstream_suite::test_empty(void)

{
  ostringstream output;
  long *local_1a0 [2];
  long local_190 [2];
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[1]>
            ("output.str()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x3c,"void ostringstream_suite::test_empty()",local_1a0,"");
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_empty()
{
    std::ostringstream output;
    ostream_buffer<char> container(output);

    TRIAL_PROTOCOL_TEST_EQUAL(output.str(), "");
}